

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O3

void Io_ReadBlifFree(Io_ReadBlif_t *p)

{
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  Vec_Str_t *__ptr_01;
  char *__ptr_02;
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  Extra_FileReaderFree(p->pReader);
  __ptr = p->vNewTokens;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  __ptr_01 = p->vCubes;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (char *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  pVVar1 = p->vInArrs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vOutReqs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vInDrives;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vOutLoads;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Io_ReadBlifFree( Io_ReadBlif_t * p )
{
    Extra_FileReaderFree( p->pReader );
    Vec_PtrFree( p->vNewTokens );
    Vec_StrFree( p->vCubes );
    Vec_IntFree( p->vInArrs );
    Vec_IntFree( p->vOutReqs );
    Vec_IntFree( p->vInDrives );
    Vec_IntFree( p->vOutLoads );
    ABC_FREE( p );
}